

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_test_suite.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * anon_unknown.dwarf_1483e9::read_bytes(string *filename)

{
  StringRef capturedExpression;
  ExprLhs<const_std::basic_ifstream<char,_std::char_traits<char>_>_&> this;
  char *pcVar1;
  string *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  streamoff length;
  AssertionHandler catchAssertionHandler;
  ifstream is;
  vector<char,_std::allocator<char>_> *bytes;
  Decomposer *in_stack_fffffffffffffcf8;
  AssertionHandler *in_stack_fffffffffffffd00;
  StringRef *in_stack_fffffffffffffd08;
  AssertionHandler *in_stack_fffffffffffffd10;
  SourceLineInfo *this_00;
  vector<char,_std::allocator<char>_> *expr;
  AssertionHandler *in_stack_fffffffffffffd30;
  SourceLineInfo local_298;
  StringRef local_288;
  char local_220 [527];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  expr = in_RDI;
  local_10 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x262141);
  std::ifstream::ifstream(local_220,local_10,_S_bin);
  local_288 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
  this_00 = &local_298;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_test_suite.cpp"
             ,0x16);
  Catch::StringRef::StringRef
            ((StringRef *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
  capturedExpression.m_size = (size_type)in_RDI;
  capturedExpression.m_start = (char *)this_00;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
             (SourceLineInfo *)in_stack_fffffffffffffd00,capturedExpression,
             (Flags)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  this = Catch::Decomposer::operator<=
                   (in_stack_fffffffffffffcf8,
                    (basic_ifstream<char,_std::char_traits<char>_> *)0x2621ea);
  Catch::AssertionHandler::handleExpr<std::ifstream_const&>
            (in_stack_fffffffffffffd30,
             (ExprLhs<const_std::basic_ifstream<char,_std::char_traits<char>_>_&> *)expr);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd00);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd00);
  std::istream::seekg((long)local_220,_S_beg);
  std::istream::tellg();
  std::fpos::operator_cast_to_long((fpos *)&stack0xfffffffffffffd30);
  std::istream::seekg((long)local_220,_S_beg);
  std::vector<char,_std::allocator<char>_>::resize(in_RDI,(size_type)this_00);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x262326);
  std::istream::read(local_220,(long)pcVar1);
  std::ifstream::close();
  local_11 = 1;
  std::ifstream::~ifstream(local_220);
  if ((local_11 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)this.m_lhs);
  }
  return expr;
}

Assistant:

std::vector<char> read_bytes(const std::string& filename)
    {
        std::vector<char> bytes;
        std::ifstream is(filename, std::ifstream::binary);
        REQUIRE(is);
        is.seekg (0, is.end);
        std::streamoff length = is.tellg();
        is.seekg (0, is.beg);
        bytes.resize(static_cast<std::size_t>(length));
        is.read(bytes.data(), static_cast<std::size_t>(length));
        is.close();
        return bytes;
    }